

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O2

CURLcode glob_url(URLGlob **glob,char *url,unsigned_long *urlnum,FILE *error)

{
  byte *__nptr;
  anon_union_40_3_e2f18bb4_for_content *paVar1;
  char cVar2;
  ushort uVar3;
  size_t sVar4;
  ushort *puVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  FILE *pFVar12;
  byte bVar13;
  uint uVar14;
  size_t sVar15;
  char *pcVar16;
  URLGlob *pUVar17;
  ushort **ppuVar18;
  ulong uVar19;
  char **ppcVar20;
  char *__dest;
  int *piVar21;
  ulong uVar22;
  CURLcode CVar23;
  long lVar24;
  int iVar25;
  URLPattern *pUVar26;
  int iVar27;
  byte *pbVar28;
  anon_union_40_3_e2f18bb4_for_content *paVar29;
  size_t __n;
  byte *pbVar30;
  bool bVar31;
  byte *local_128;
  char end_c;
  char max_c;
  char min_c;
  int local_114;
  byte *local_110;
  anon_union_40_3_e2f18bb4_for_content *local_108;
  byte *local_100;
  URLGlob *local_f8;
  byte *local_f0;
  ulong local_e8;
  unsigned_long *local_e0;
  FILE *local_d8;
  byte *local_d0;
  URLGlob **local_c8;
  URLPattern *local_c0;
  char *endp;
  
  *glob = (URLGlob *)0x0;
  local_d8 = error;
  sVar15 = strlen(url);
  pcVar16 = (char *)malloc(sVar15 + 1);
  if (pcVar16 != (char *)0x0) {
    *pcVar16 = '\0';
    local_128 = (byte *)0x1;
    local_e0 = urlnum;
    local_c8 = glob;
    pUVar17 = (URLGlob *)calloc(1,0x12f0);
    if (pUVar17 != (URLGlob *)0x0) {
      pUVar17->urllen = sVar15;
      pUVar17->glob_buffer = pcVar16;
      CVar23 = CURLE_OK;
      local_114 = 0;
      pbVar28 = local_128;
      local_f8 = pUVar17;
LAB_00115b02:
      if ((CVar23 == CURLE_OK) && (*url != 0)) {
        pbVar30 = (byte *)pUVar17->glob_buffer;
        sVar15 = 0;
        local_100 = pbVar28;
        do {
          while( true ) {
            __n = 1;
            bVar13 = *url;
            if (bVar13 == 0x5b) break;
            if (bVar13 == 0) goto LAB_00115c0f;
            if (bVar13 != 0x5c) {
              if (bVar13 != 0x5d) {
                if (bVar13 == 0x7b) goto LAB_00115c0f;
                if (bVar13 != 0x7d) goto LAB_00115bf2;
              }
              pcVar16 = "unmatched close brace/bracket";
              goto LAB_00116408;
            }
            pbVar28 = (byte *)url + 1;
            bVar13 = 0x5c;
            uVar14 = *pbVar28 - 0x5b;
            if ((uVar14 < 0x23) && ((0x500000005U >> ((ulong)uVar14 & 0x3f) & 1) != 0)) {
              url = (char *)((byte *)url + 1);
              local_128 = local_128 + 1;
              bVar13 = *pbVar28;
            }
LAB_00115bf2:
            url = (char *)((byte *)url + 1);
            *pbVar30 = bVar13;
            pbVar30 = pbVar30 + 1;
            local_128 = local_128 + 1;
            sVar15 = sVar15 + 1;
          }
          ppuVar18 = __ctype_b_loc();
          uVar19 = 0;
          while( true ) {
            pbVar28 = (byte *)url + __n + 1;
            while( true ) {
              __n = __n + 1;
              bVar13 = pbVar28[-1];
              if (((((*ppuVar18)[bVar13] & 8) == 0) && (bVar13 != 0x25)) && (bVar13 != 0x2e)) break;
              pbVar28 = pbVar28 + 1;
            }
            if (bVar13 != 0x3a) break;
            uVar19 = uVar19 + 1;
          }
          if ((bVar13 != 0x5d) || (uVar19 < 2)) goto LAB_00115c0a;
          memcpy(pbVar30,url,__n);
          pbVar30 = pbVar30 + __n;
          sVar15 = sVar15 + __n;
          url = (char *)pbVar28;
        } while( true );
      }
      if (CVar23 == CURLE_OK) {
        *local_e0 = (unsigned_long)pbVar28;
        *local_c8 = pUVar17;
        return CURLE_OK;
      }
      goto LAB_00116423;
    }
    free(pcVar16);
  }
  return CURLE_OUT_OF_MEMORY;
LAB_00115c0a:
  bVar13 = 0x5b;
LAB_00115c0f:
  uVar19 = 1;
  if (sVar15 != 0) {
    *pbVar30 = 0;
    pcVar16 = pUVar17->glob_buffer;
    sVar4 = pUVar17->size;
    pUVar17->pattern[sVar4].type = UPTSet;
    pUVar17->pattern[sVar4].globindex = -1;
    pUVar17->pattern[sVar4].content.NumRange.max_n = 1;
    ppcVar20 = (char **)malloc(8);
    pUVar17->pattern[sVar4].content.Set.elements = ppcVar20;
    if (ppcVar20 != (char **)0x0) {
      __dest = (char *)malloc(sVar15 + 1);
      *ppcVar20 = __dest;
      if (__dest != (char *)0x0) {
        memcpy(__dest,pcVar16,sVar15);
        __dest[sVar15] = '\0';
        CVar23 = CURLE_OK;
        goto LAB_00115cad;
      }
    }
    pUVar17->error = "out of memory";
    pUVar17->pos = 0;
    CVar23 = CURLE_OUT_OF_MEMORY;
    goto LAB_00115cad;
  }
  CVar23 = CURLE_OK;
  if (bVar13 != 0x5b) {
    if (bVar13 == 0x7b) {
      pbVar28 = (byte *)url + 1;
      local_110 = (byte *)pUVar17->glob_buffer;
      sVar4 = pUVar17->size;
      pUVar26 = pUVar17->pattern + sVar4;
      pUVar17->pattern[sVar4].type = UPTSet;
      paVar29 = &pUVar17->pattern[sVar4].content;
      paVar1 = &pUVar17->pattern[sVar4].content;
      (paVar1->Set).elements = (char **)0x0;
      ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar1->Set + 8))->min_c = '\0';
      ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar1->Set + 8))->max_c = '\0';
      ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar1->Set + 8))->ptr_c = '\0';
      ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar1->Set + 8))->field_0x3 = 0;
      ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar1->Set + 8))->step = 0;
      pUVar17->pattern[sVar4].globindex = local_114;
      local_114 = local_114 + 1;
      local_f0 = local_128;
      local_108 = paVar29;
      local_c0 = pUVar26;
LAB_00115d4b:
      iVar27 = 1;
      pbVar30 = local_f0 + 1;
      local_e8 = uVar19;
      local_d0 = local_f0;
      do {
        local_f0 = pbVar30;
        bVar31 = iVar27 == 0;
        iVar27 = iVar27 + -1;
        if (bVar31) {
          pbVar28 = pbVar28 + local_e8;
          local_128 = local_f0;
          pbVar30 = local_100;
          goto LAB_001160bb;
        }
        bVar13 = ((byte *)url)[uVar19];
        pbVar30 = local_100;
        if (bVar13 != 0x2c) {
          if (bVar13 == 0x7d) {
            if (uVar19 == 1) {
              pUVar17->error = "empty string within braces";
              pUVar17->pos = (size_t)local_f0;
            }
            else {
              auVar6._8_8_ = 0;
              auVar6._0_8_ = (long)(pUVar26->content).Set.size + 1;
              auVar9._8_8_ = 0;
              auVar9._0_8_ = local_100;
              pbVar30 = SUB168(auVar6 * auVar9,0);
              if (SUB168(auVar6 * auVar9,8) == 0) goto LAB_00115d99;
              pUVar17->error = "range overflow";
              pUVar17->pos = 0;
            }
          }
          else {
            if ((bVar13 != 0x7b) && (bVar13 != 0x5b)) {
              if (bVar13 == 0x5c) {
                bVar13 = ((byte *)url)[uVar19 + 1];
                if (bVar13 == 0) {
                  bVar13 = 0x5c;
                }
                else {
                  uVar19 = uVar19 + 1;
                  local_f0 = local_d0 + 2;
                }
              }
              else {
                if (bVar13 == 0x5d) {
                  pcVar16 = "unexpected close bracket";
                  goto LAB_0011611d;
                }
                if (bVar13 == 0) {
                  pUVar17->error = "unmatched brace";
                  pUVar17->pos = (size_t)local_128;
                  goto LAB_00116225;
                }
              }
              *local_110 = bVar13;
              local_110 = local_110 + 1;
              goto LAB_00115ea6;
            }
            pcVar16 = "nested brace";
LAB_0011611d:
            pUVar17->error = pcVar16;
            pUVar17->pos = (size_t)local_f0;
          }
LAB_00116225:
          CVar23 = CURLE_URL_MALFORMAT;
          url = (char *)pbVar28;
          local_128 = local_f0;
          break;
        }
LAB_00115d99:
        local_100 = pbVar30;
        *local_110 = 0;
        if ((paVar29->Set).elements == (char **)0x0) {
          ppcVar20 = (char **)malloc(8);
          (paVar29->Set).elements = ppcVar20;
          if (ppcVar20 != (char **)0x0) {
            iVar25 = (pUVar26->content).Set.size;
            goto LAB_00115ded;
          }
LAB_00115fb0:
          local_f8->error = "out of memory";
          local_f8->pos = 0;
          CVar23 = CURLE_OUT_OF_MEMORY;
          url = (char *)pbVar28;
          local_128 = local_f0;
          pUVar17 = local_f8;
          break;
        }
        iVar25 = (pUVar26->content).Set.size;
        ppcVar20 = (char **)realloc((paVar29->Set).elements,(long)iVar25 * 8 + 8);
        if (ppcVar20 == (char **)0x0) goto LAB_00115fb0;
        (local_108->Set).elements = ppcVar20;
LAB_00115ded:
        pcVar16 = strdup(local_f8->glob_buffer);
        ppcVar20[iVar25] = pcVar16;
        if (pcVar16 == (char *)0x0) goto LAB_00115fb0;
        (local_c0->content).Set.size = iVar25 + 1;
        pUVar26 = local_c0;
        paVar29 = local_108;
        pUVar17 = local_f8;
        if (((byte *)url)[uVar19] != 0x7d) goto LAB_00115e66;
        uVar19 = uVar19 + 1;
        pbVar30 = local_f0;
      } while( true );
    }
    goto LAB_00115cad;
  }
  __nptr = (byte *)url + 1;
  local_128 = local_128 + 1;
  paVar1 = (anon_union_40_3_e2f18bb4_for_content *)(pUVar17->pattern + pUVar17->size);
  pUVar17->pattern[pUVar17->size].globindex = local_114;
  local_114 = local_114 + 1;
  ppuVar18 = __ctype_b_loc();
  puVar5 = *ppuVar18;
  uVar3 = puVar5[((byte *)url)[1]];
  local_108 = paVar1;
  if ((uVar3 >> 10 & 1) == 0) {
    if ((uVar3 >> 0xb & 1) != 0) {
      *(undefined4 *)paVar1 = 3;
      *(undefined4 *)((long)paVar1 + 0x18) = 0;
      if (*__nptr == 0x30) {
        bVar13 = 0x30;
        lVar24 = 2;
        while ((*(byte *)((long)puVar5 + (ulong)bVar13 * 2 + 1) & 8) != 0) {
          *(int *)((long)paVar1 + 0x18) = (int)lVar24 + -1;
          bVar13 = ((byte *)url)[lVar24];
          lVar24 = lVar24 + 1;
        }
      }
      piVar21 = __errno_location();
      *piVar21 = 0;
      pbVar28 = (byte *)strtoul((char *)__nptr,&endp,10);
      pbVar30 = __nptr;
      if (((*piVar21 == 0) && ((byte *)endp != __nptr)) && (url = endp, *endp == '-')) {
        do {
          do {
            url = (char *)((byte *)url + 1);
            bVar13 = *url;
          } while (bVar13 == 0x20);
        } while (bVar13 == 9);
        pbVar30 = (byte *)url;
        if ((*(byte *)((long)*ppuVar18 + (ulong)bVar13 * 2 + 1) & 8) == 0) goto LAB_00116059;
        *piVar21 = 0;
        local_110 = pbVar28;
        pbVar30 = (byte *)strtoul(url,&endp,10);
        if ((*piVar21 == 0) && (cVar2 = *endp, cVar2 != ':')) {
LAB_001163a2:
          if (cVar2 == ']') {
            url = endp + 1;
            bVar31 = true;
            pbVar28 = local_110;
          }
          else {
LAB_001163b3:
            bVar31 = false;
            pbVar28 = local_110;
          }
        }
        else {
          url = endp + 1;
          *piVar21 = 0;
          uVar19 = strtoul(url,&endp,10);
          if (*piVar21 == 0) {
            if (endp != (char *)0x0) {
              cVar2 = *endp;
              goto LAB_001163a2;
            }
            goto LAB_001163b3;
          }
          bVar31 = false;
          pbVar28 = local_110;
        }
      }
      else {
LAB_00116059:
        url = (char *)pbVar30;
        pbVar30 = (byte *)0x0;
        uVar19 = 0;
        bVar31 = false;
      }
      local_128 = (byte *)url + ((long)local_128 - (long)__nptr);
      pcVar16 = "bad range";
      if (((bVar31) && (pcVar16 = "bad range", uVar19 != 0)) &&
         ((pbVar28 != pbVar30 || (pcVar16 = "bad range", uVar19 == 1)))) {
        uVar22 = (long)pbVar30 - (long)pbVar28;
        if (uVar22 == 0) {
          uVar22 = 0;
        }
        else {
          pcVar16 = "bad range";
          if ((pbVar30 < pbVar28) || (pcVar16 = "bad range", uVar22 < uVar19)) goto LAB_001162b1;
        }
        *(byte **)((long)local_108 + 8) = pbVar28;
        *(byte **)((long)local_108 + 0x20) = pbVar28;
        *(byte **)((long)local_108 + 0x10) = pbVar30;
        local_108[1].NumRange.min_n = uVar19;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uVar22 / uVar19 + 1;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_100;
        pcVar16 = "range overflow";
        if (SUB168(auVar8 * auVar11,8) == 0) {
          CVar23 = CURLE_OK;
          local_100 = SUB168(auVar8 * auVar11,0);
          goto LAB_00115cad;
        }
      }
LAB_001162b1:
      pUVar17->error = pcVar16;
      goto LAB_001162b8;
    }
    pUVar17->error = "bad range specification";
    pUVar17->pos = (size_t)local_128;
  }
  else {
    *(undefined4 *)paVar1 = 2;
    iVar27 = __isoc99_sscanf(__nptr,"%c-%c%c",&min_c,&max_c,&end_c);
    bVar31 = true;
    pbVar28 = __nptr;
    if (iVar27 == 3) {
      if (end_c == ']') {
        bVar31 = false;
        pbVar28 = (byte *)url + 5;
      }
      else {
        bVar31 = true;
        if (end_c == ':') {
          piVar21 = __errno_location();
          *piVar21 = 0;
          uVar19 = strtoul((char *)((byte *)url + 5),&endp,10);
          if ((*piVar21 == 0) && ((byte *)url + 5 != (byte *)endp)) {
            pbVar28 = (byte *)(endp + 1);
            if (*endp != ']') {
              uVar19 = 0;
              pbVar28 = __nptr;
            }
          }
          else {
            uVar19 = 0;
          }
          bVar31 = false;
        }
      }
    }
    local_128 = pbVar28 + ((long)local_128 - (long)__nptr);
    pcVar16 = "bad range";
    if (((!bVar31) && (pcVar16 = "bad range", 0xffffffff80000000 < uVar19 - 0x80000000)) &&
       ((min_c != max_c || (pcVar16 = "bad range", uVar19 == 1)))) {
      if (min_c == max_c) {
        uVar14 = (int)max_c - (int)min_c;
LAB_001161bb:
        *(int *)((long)local_108 + 0xc) = (int)uVar19;
        *(char *)((long)local_108 + 8) = min_c;
        *(char *)((long)local_108 + 10) = min_c;
        *(char *)((long)local_108 + 9) = max_c;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = (long)((int)uVar14 / (int)uVar19 + 1);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = local_100;
        pcVar16 = "range overflow";
        pbVar30 = SUB168(auVar7 * auVar10,0);
        if (SUB168(auVar7 * auVar10,8) == 0) {
LAB_001160bb:
          local_100 = pbVar30;
          CVar23 = CURLE_OK;
          url = (char *)pbVar28;
          goto LAB_00115cad;
        }
      }
      else {
        pcVar16 = "bad range";
        if (min_c <= max_c) {
          uVar14 = (int)max_c - (int)min_c;
          pcVar16 = "bad range";
          if (((int)uVar14 < 0x1a) && (pcVar16 = "bad range", uVar19 <= uVar14)) goto LAB_001161bb;
        }
      }
    }
    pUVar17->error = pcVar16;
LAB_001162b8:
    pUVar17->pos = (size_t)local_128;
  }
  CVar23 = CURLE_URL_MALFORMAT;
  url = (char *)__nptr;
LAB_00115cad:
  uVar19 = pUVar17->size + 1;
  pUVar17->size = uVar19;
  pbVar28 = local_100;
  if (99 < uVar19) {
    pcVar16 = "too many globs";
LAB_00116408:
    pUVar17->error = pcVar16;
    pUVar17->pos = (size_t)local_128;
    CVar23 = CURLE_URL_MALFORMAT;
LAB_00116423:
    pFVar12 = local_d8;
    if ((local_d8 != (FILE *)0x0) && (ppcVar20 = (char **)pUVar17->error, ppcVar20 != (char **)0x0))
    {
      if (pUVar17->pos != 0) {
        curl_msnprintf(&endp,0x80,"%s in column %zu");
        ppcVar20 = &endp;
      }
      curl_mfprintf(pFVar12,"curl: (%d) [globbing] %s\n",CVar23,ppcVar20);
    }
    glob_cleanup(pUVar17);
    *local_e0 = 1;
    return CVar23;
  }
  goto LAB_00115b02;
LAB_00115e66:
  local_110 = (byte *)local_f8->glob_buffer;
LAB_00115ea6:
  uVar19 = uVar19 + 1;
  goto LAB_00115d4b;
}

Assistant:

CURLcode glob_url(URLGlob **glob, char *url, unsigned long *urlnum,
                  FILE *error)
{
  /*
   * We can deal with any-size, just make a buffer with the same length
   * as the specified URL!
   */
  URLGlob *glob_expand;
  unsigned long amount = 0;
  char *glob_buffer;
  CURLcode res;

  *glob = NULL;

  glob_buffer = malloc(strlen(url) + 1);
  if(!glob_buffer)
    return CURLE_OUT_OF_MEMORY;
  glob_buffer[0]=0;

  glob_expand = calloc(1, sizeof(URLGlob));
  if(!glob_expand) {
    Curl_safefree(glob_buffer);
    return CURLE_OUT_OF_MEMORY;
  }
  glob_expand->urllen = strlen(url);
  glob_expand->glob_buffer = glob_buffer;

  res = glob_parse(glob_expand, url, 1, &amount);
  if(!res)
    *urlnum = amount;
  else {
    if(error && glob_expand->error) {
      char text[128];
      const char *t;
      if(glob_expand->pos) {
        snprintf(text, sizeof(text), "%s in column %zu", glob_expand->error,
                 glob_expand->pos);
        t = text;
      }
      else
        t = glob_expand->error;

      /* send error description to the error-stream */
      fprintf(error, "curl: (%d) [globbing] %s\n", res, t);
    }
    /* it failed, we cleanup */
    glob_cleanup(glob_expand);
    *urlnum = 1;
    return res;
  }

  *glob = glob_expand;
  return CURLE_OK;
}